

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void ** __thiscall llvm::SmallPtrSetImplBase::FindBucketFor(SmallPtrSetImplBase *this,void *Ptr)

{
  void *pvVar1;
  uint uVar2;
  void *pvVar3;
  void **local_58;
  void **local_40;
  void **Tombstone;
  void **Array;
  uint ProbeAmt;
  uint ArraySize;
  uint Bucket;
  void *Ptr_local;
  SmallPtrSetImplBase *this_local;
  
  uVar2 = DenseMapInfo<void_*>::getHashValue(Ptr);
  ProbeAmt = uVar2 & this->CurArraySize - 1;
  uVar2 = this->CurArraySize;
  Array._4_4_ = 1;
  local_58 = this->CurArray;
  local_40 = (void **)0x0;
  while( true ) {
    pvVar1 = local_58[ProbeAmt];
    pvVar3 = getEmptyMarker();
    if (pvVar1 == pvVar3) {
      if (local_40 == (void **)0x0) {
        local_58 = local_58 + ProbeAmt;
      }
      else {
        local_58 = local_40;
      }
      return local_58;
    }
    if (local_58[ProbeAmt] == Ptr) break;
    pvVar1 = local_58[ProbeAmt];
    pvVar3 = getTombstoneMarker();
    if ((pvVar1 == pvVar3) && (local_40 == (void **)0x0)) {
      local_40 = local_58 + ProbeAmt;
    }
    ProbeAmt = ProbeAmt + Array._4_4_ & uVar2 - 1;
    Array._4_4_ = Array._4_4_ + 1;
  }
  return local_58 + ProbeAmt;
}

Assistant:

const void * const *SmallPtrSetImplBase::FindBucketFor(const void *Ptr) const {
  unsigned Bucket = DenseMapInfo<void *>::getHashValue(Ptr) & (CurArraySize-1);
  unsigned ArraySize = CurArraySize;
  unsigned ProbeAmt = 1;
  const void *const *Array = CurArray;
  const void *const *Tombstone = nullptr;
  while (true) {
    // If we found an empty bucket, the pointer doesn't exist in the set.
    // Return a tombstone if we've seen one so far, or the empty bucket if
    // not.
    if (LLVM_LIKELY(Array[Bucket] == getEmptyMarker()))
      return Tombstone ? Tombstone : Array+Bucket;

    // Found Ptr's bucket?
    if (LLVM_LIKELY(Array[Bucket] == Ptr))
      return Array+Bucket;

    // If this is a tombstone, remember it.  If Ptr ends up not in the set, we
    // prefer to return it than something that would require more probing.
    if (Array[Bucket] == getTombstoneMarker() && !Tombstone)
      Tombstone = Array+Bucket;  // Remember the first tombstone found.

    // It's a hash collision or a tombstone. Reprobe.
    Bucket = (Bucket + ProbeAmt++) & (ArraySize-1);
  }
}